

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O1

void __thiscall
cbtQuantizedBvh::walkStacklessQuantizedTreeCacheFriendly
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  int startNodeIndex;
  cbtBvhSubtreeInfo *pcVar1;
  long lVar2;
  long lVar3;
  
  if (0 < (this->m_SubtreeHeaders).m_size) {
    lVar3 = 0x10;
    lVar2 = 0;
    do {
      pcVar1 = (this->m_SubtreeHeaders).m_data;
      if ((((*quantizedQueryAabbMin <= *(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -10))
           && (*(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -0x10) <=
               *quantizedQueryAabbMax)) &&
          (quantizedQueryAabbMin[2] <= *(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -6)))
         && (((*(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -0xc) <=
               quantizedQueryAabbMax[2] &&
              (quantizedQueryAabbMin[1] <=
               *(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -8))) &&
             (*(ushort *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -0xe) <=
              quantizedQueryAabbMax[1])))) {
        startNodeIndex = *(int *)((long)pcVar1->m_quantizedAabbMin + lVar3 + -4);
        walkStacklessQuantizedTree
                  (this,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax,startNodeIndex,
                   *(int *)((long)pcVar1->m_quantizedAabbMin + lVar3) + startNodeIndex);
      }
      lVar2 = lVar2 + 1;
      lVar3 = lVar3 + 0x20;
    } while (lVar2 < (this->m_SubtreeHeaders).m_size);
  }
  return;
}

Assistant:

void cbtQuantizedBvh::walkStacklessQuantizedTreeCacheFriendly(cbtNodeOverlapCallback* nodeCallback, unsigned short int* quantizedQueryAabbMin, unsigned short int* quantizedQueryAabbMax) const
{
	cbtAssert(m_useQuantization);

	int i;

	for (i = 0; i < this->m_SubtreeHeaders.size(); i++)
	{
		const cbtBvhSubtreeInfo& subtree = m_SubtreeHeaders[i];

		//PCK: unsigned instead of bool
		unsigned overlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin, quantizedQueryAabbMax, subtree.m_quantizedAabbMin, subtree.m_quantizedAabbMax);
		if (overlap != 0)
		{
			walkStacklessQuantizedTree(nodeCallback, quantizedQueryAabbMin, quantizedQueryAabbMax,
									   subtree.m_rootNodeIndex,
									   subtree.m_rootNodeIndex + subtree.m_subtreeSize);
		}
	}
}